

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O0

CheckedError __thiscall flatbuffers::Parser::ParseHexNum(Parser *this,int nibbles,uint64_t *val)

{
  bool bVar1;
  char *pcVar2;
  uint64_t uVar3;
  uint64_t *in_RCX;
  long lVar4;
  undefined4 in_register_00000034;
  string *msg;
  allocator<char> local_c1;
  string local_c0 [8];
  string target;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  int local_2c;
  uint64_t *puStack_28;
  int i;
  uint64_t *val_local;
  string *psStack_18;
  int nibbles_local;
  Parser *this_local;
  
  msg = (string *)CONCAT44(in_register_00000034,nibbles);
  val_local._4_4_ = (int)val;
  psStack_18 = msg;
  this_local = this;
  if (val_local._4_4_ < 1) {
    __assert_fail("nibbles > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_parser.cpp"
                  ,0x1c8,"CheckedError flatbuffers::Parser::ParseHexNum(int, uint64_t *)");
  }
  local_2c = 0;
  puStack_28 = in_RCX;
  do {
    if (val_local._4_4_ <= local_2c) {
      pcVar2 = (char *)msg->_M_string_length;
      lVar4 = (long)val_local._4_4_;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<char_const*,void>(local_c0,pcVar2,pcVar2 + lVar4,&local_c1);
      std::allocator<char>::~allocator(&local_c1);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      uVar3 = StringToUInt(pcVar2,0x10);
      *puStack_28 = uVar3;
      msg->_M_string_length = msg->_M_string_length + (long)val_local._4_4_;
      anon_unknown_0::NoError();
      std::__cxx11::string::~string(local_c0);
LAB_00106632:
      return SUB82(this,0);
    }
    bVar1 = is_xdigit(*(char *)(msg->_M_string_length + (long)local_2c));
    if (!bVar1) {
      NumToString<int>(&local_90,val_local._4_4_);
      std::operator+(&local_70,"escape code must be followed by ",&local_90);
      std::operator+(&local_50,&local_70," hex digits");
      Error(this,msg);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      goto LAB_00106632;
    }
    local_2c = local_2c + 1;
  } while( true );
}

Assistant:

CheckedError Parser::ParseHexNum(int nibbles, uint64_t *val) {
  FLATBUFFERS_ASSERT(nibbles > 0);
  for (int i = 0; i < nibbles; i++)
    if (!is_xdigit(cursor_[i]))
      return Error("escape code must be followed by " + NumToString(nibbles) +
                   " hex digits");
  std::string target(cursor_, cursor_ + nibbles);
  *val = StringToUInt(target.c_str(), 16);
  cursor_ += nibbles;
  return NoError();
}